

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O2

int inflateReset(z_streamp strm)

{
  internal_state *piVar1;
  internal_state *piVar2;
  int iVar3;
  
  iVar3 = -2;
  if ((strm != (z_streamp)0x0) && (piVar2 = strm->state, piVar2 != (internal_state *)0x0)) {
    *(undefined8 *)(piVar2 + 0x20) = 0;
    strm->total_in = 0;
    strm->total_out = 0;
    strm->msg = (char *)0x0;
    strm->adler = 1;
    *(undefined8 *)piVar2 = 0;
    *(undefined4 *)(piVar2 + 0xc) = 0;
    *(undefined4 *)(piVar2 + 0x14) = 0x8000;
    *(undefined8 *)(piVar2 + 0x28) = 0;
    *(undefined8 *)(piVar2 + 0x34) = 0;
    *(undefined4 *)(piVar2 + 0x3c) = 0;
    *(undefined8 *)(piVar2 + 0x48) = 0;
    *(undefined4 *)(piVar2 + 0x50) = 0;
    piVar1 = piVar2 + 0x550;
    *(internal_state **)(piVar2 + 0x88) = piVar1;
    *(internal_state **)(piVar2 + 0x68) = piVar1;
    *(internal_state **)(piVar2 + 0x60) = piVar1;
    *(undefined8 *)(piVar2 + 0x1be0) = 0xffffffff00000001;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int ZEXPORT inflateReset(strm)
z_streamp strm;
{
    struct inflate_state FAR *state;

    if (strm == Z_NULL || strm->state == Z_NULL) return Z_STREAM_ERROR;
    state = (struct inflate_state FAR *)strm->state;
    strm->total_in = strm->total_out = state->total = 0;
    strm->msg = Z_NULL;
    strm->adler = 1;        /* to support ill-conceived Java test suite */
    state->mode = HEAD;
    state->last = 0;
    state->havedict = 0;
    state->dmax = 32768U;
    state->head = Z_NULL;
    state->wsize = 0;
    state->whave = 0;
    state->wnext = 0;
    state->hold = 0;
    state->bits = 0;
    state->lencode = state->distcode = state->next = state->codes;
    state->sane = 1;
    state->back = -1;
    Tracev((stderr, "inflate: reset\n"));
    return Z_OK;
}